

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O0

void parseURL(string *url,string *service,string *hostname,string *path)

{
  undefined8 *puVar1;
  char *error;
  string local_88 [32];
  long local_68;
  size_t hostEnd;
  long local_30;
  size_t serviceEnd;
  string *path_local;
  string *hostname_local;
  string *service_local;
  string *url_local;
  
  serviceEnd = (size_t)path;
  path_local = hostname;
  hostname_local = service;
  service_local = url;
  local_30 = std::__cxx11::string::find((char *)url,0x1a30bc);
  if (local_30 == -1) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "Can\'t find service name.";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  std::__cxx11::string::substr((ulong)&hostEnd,(ulong)service_local);
  std::__cxx11::string::operator=((string *)hostname_local,(string *)&hostEnd);
  std::__cxx11::string::~string((string *)&hostEnd);
  local_30 = local_30 + 3;
  local_68 = std::__cxx11::string::find((char *)service_local,0x1a30be);
  if (local_68 == -1) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "Can\'t find end of host name.";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  std::__cxx11::string::substr((ulong)local_88,(ulong)service_local);
  std::__cxx11::string::operator=((string *)path_local,local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::substr((ulong)&error,(ulong)service_local);
  std::__cxx11::string::operator=((string *)serviceEnd,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void parseURL( const string& url, string& service, string& hostname, string& path ){
    try {
        // Service (http/https) is up to the ://.
        size_t serviceEnd = url.find( "://" );
        if( serviceEnd == -1 ){
            throw "Can't find service name.";
        }
        service = url.substr( 0, serviceEnd );
        serviceEnd += 3;

        // Host name is up to the first / after the service name marker.
        size_t hostEnd = url.find( "/", serviceEnd );
        if( hostEnd == -1 ){
            throw "Can't find end of host name.";
        }
        hostname = url.substr( serviceEnd, hostEnd - serviceEnd );

        // Path is everything else.
        path = url.substr( hostEnd );
    }
    catch( const char* error ){
        cerr << "Error parsing url \"" << url << "\": " << error << endl;
        exit( BAD_ARGUMENTS );
    }
}